

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

void ignore_comment(char *line)

{
  char cVar1;
  char *__haystack;
  char *pcVar2;
  
  __haystack = strstr(line,"/*");
  if (__haystack != (char *)0x0) {
    pcVar2 = strstr(__haystack,"*/");
    if (pcVar2 == (char *)0x0) {
      vrna_message_error("unclosed comment in parameter file");
    }
    cVar1 = pcVar2[2];
    if (cVar1 != '\0') {
      pcVar2 = pcVar2 + 3;
      do {
        *__haystack = cVar1;
        __haystack = __haystack + 1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while (cVar1 != '\0');
    }
    *__haystack = '\0';
  }
  return;
}

Assistant:

PRIVATE void
ignore_comment(char *line)
{
  /*
   * excise C style comments
   * only one comment per line, no multiline comments
   */
  char *cp1, *cp2;

  if ((cp1 = strstr(line, "/*"))) {
    cp2 = strstr(cp1, "*/");
    if (cp2 == NULL)
      vrna_message_error("unclosed comment in parameter file");

    /* can't use strcpy for overlapping strings */
    for (cp2 += 2; *cp2 != '\0'; cp2++, cp1++)
      *cp1 = *cp2;
    *cp1 = '\0';
  }

  return;
}